

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcProve.c
# Opt level: O0

int Abc_NtkMiterProve(Abc_Ntk_t **ppNtk,void *pPars)

{
  DdNode *pDVar1;
  Abc_Ntk_t *pAVar2;
  int iVar3;
  uint uVar4;
  Abc_Obj_t *pAVar5;
  DdNode *pDVar6;
  int *piVar7;
  char *pcVar8;
  char *pcVar9;
  double dVar10;
  ABC_INT64_T local_d0;
  bool local_b9;
  ABC_INT64_T local_a8;
  ABC_INT64_T local_88;
  ABC_INT64_T nInspectLimit;
  ABC_INT64_T nSatInspects;
  ABC_INT64_T nSatConfs;
  abctime clk;
  int Counter;
  int nSatFails;
  int nIter;
  int RetValue;
  Abc_Ntk_t *pNtkTemp;
  Abc_Ntk_t *pNtk;
  Prove_Params_t *pParams;
  void *pPars_local;
  Abc_Ntk_t **ppNtk_local;
  
  nSatFails = -1;
  pNtkTemp = *ppNtk;
  pNtk = (Abc_Ntk_t *)pPars;
  pParams = (Prove_Params_t *)pPars;
  pPars_local = ppNtk;
  iVar3 = Abc_NtkIsStrash(pNtkTemp);
  if (iVar3 == 0) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcProve.c"
                  ,0x48,"int Abc_NtkMiterProve(Abc_Ntk_t **, void *)");
  }
  iVar3 = Abc_NtkPoNum(pNtkTemp);
  if (iVar3 != 1) {
    __assert_fail("Abc_NtkPoNum(pNtk) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcProve.c"
                  ,0x49,"int Abc_NtkMiterProve(Abc_Ntk_t **, void *)");
  }
  if (*(int *)((long)&pNtk->pName + 4) != 0) {
    pcVar9 = "no";
    if (pNtk->ntkFunc != ABC_FUNC_NONE) {
      pcVar9 = "yes";
    }
    pcVar8 = "no";
    if (pNtk->ntkType != ABC_NTK_NONE) {
      pcVar8 = "yes";
    }
    printf("RESOURCE LIMITS: Iterations = %d. Rewriting = %s. Fraiging = %s.\n",
           (ulong)*(uint *)&pNtk->pSpec,pcVar9,pcVar8);
    printf("Miter = %d (%3.1f).  Rwr = %d (%3.1f).  Fraig = %d (%3.1f).  Last = %d.\n",
           (double)*(float *)&pNtk->pManName,(double)*(float *)&pNtk->vObjs,
           (double)*(float *)&pNtk->vPis,(ulong)*(uint *)((long)&pNtk->pSpec + 4),
           (ulong)*(uint *)((long)&pNtk->pManName + 4),(ulong)*(uint *)((long)&pNtk->vObjs + 4),
           (ulong)*(uint *)((long)&pNtk->vPos + 4));
  }
  if ((pNtk->ntkFunc == ABC_FUNC_NONE) && (pNtk->ntkType == ABC_NTK_NONE)) {
    nSatConfs = Abc_Clock();
    nSatFails = Abc_NtkMiterSat(pNtkTemp,(long)*(int *)((long)&pNtk->vPos + 4),0,0,
                                (ABC_INT64_T *)0x0,(ABC_INT64_T *)0x0);
    Abc_NtkMiterPrint(pNtkTemp,"SAT solving",nSatConfs,*(int *)((long)&pNtk->pName + 4));
    *(Abc_Ntk_t **)pPars_local = pNtkTemp;
    ppNtk_local._4_4_ = nSatFails;
  }
  else {
    for (Counter = 0; Counter < *(int *)&pNtk->pSpec; Counter = Counter + 1) {
      if (*(int *)((long)&pNtk->pName + 4) != 0) {
        uVar4 = Counter + 1;
        iVar3 = *(int *)((long)&pNtk->pSpec + 4);
        dVar10 = pow((double)*(float *)&pNtk->pManName,(double)Counter);
        pow((double)*(float *)&pNtk->vPis,(double)Counter);
        printf("ITERATION %2d : Confs = %6d. FraigBTL = %3d. \n",(ulong)uVar4,
               (ulong)(uint)(int)((double)iVar3 * dVar10));
        fflush(_stdout);
      }
      nSatConfs = Abc_Clock();
      pAVar2 = pNtkTemp;
      if (pNtk->vCos == (Vec_Ptr_t *)0x0) {
        local_88 = 0;
      }
      else {
        local_88 = (long)pNtk->vCos - (long)pNtk->vBoxes;
      }
      iVar3 = *(int *)((long)&pNtk->pSpec + 4);
      dVar10 = pow((double)*(float *)&pNtk->pManName,(double)Counter);
      nSatFails = Abc_NtkMiterSat(pAVar2,(long)((double)iVar3 * dVar10),local_88,0,&nSatInspects,
                                  &nInspectLimit);
      Abc_NtkMiterPrint(pNtkTemp,"SAT solving",nSatConfs,*(int *)((long)&pNtk->pName + 4));
      if (-1 < nSatFails) break;
      pNtk->vPios = (Vec_Ptr_t *)((long)&pNtk->vPios->nCap + nSatInspects);
      pNtk->vBoxes = (Vec_Ptr_t *)((long)&pNtk->vBoxes->nCap + nInspectLimit);
      if (((pNtk->vCis != (Vec_Ptr_t *)0x0) && ((long)pNtk->vCis <= (long)pNtk->vPios)) ||
         ((pNtk->vCos != (Vec_Ptr_t *)0x0 && ((long)pNtk->vCos <= (long)pNtk->vBoxes)))) {
        printf("Reached global limit on conflicts/inspects. Quitting.\n");
        *(Abc_Ntk_t **)pPars_local = pNtkTemp;
        return -1;
      }
      if (pNtk->ntkFunc != ABC_FUNC_NONE) {
        nSatConfs = Abc_Clock();
        iVar3 = *(int *)((long)&pNtk->pManName + 4);
        dVar10 = pow((double)*(float *)&pNtk->vObjs,(double)Counter);
        clk._0_4_ = (int)((double)iVar3 * dVar10);
        while( true ) {
          Abc_NtkRewrite(pNtkTemp,0,0,0,0,0);
          nSatFails = Abc_NtkMiterIsConstant(pNtkTemp);
          if ((-1 < nSatFails) || (clk._0_4_ = (int)clk + -1, (int)clk == 0)) break;
          Abc_NtkRefactor(pNtkTemp,10,0x10,0,0,0,0);
          nSatFails = Abc_NtkMiterIsConstant(pNtkTemp);
          if ((-1 < nSatFails) || (clk._0_4_ = (int)clk + -1, (int)clk == 0)) break;
          _nIter = pNtkTemp;
          pNtkTemp = Abc_NtkBalance(pNtkTemp,0,0,0);
          Abc_NtkDelete(_nIter);
          nSatFails = Abc_NtkMiterIsConstant(pNtkTemp);
          if ((-1 < nSatFails) || (clk._0_4_ = (int)clk + -1, (int)clk == 0)) break;
        }
        Abc_NtkMiterPrint(pNtkTemp,"Rewriting  ",nSatConfs,*(int *)((long)&pNtk->pName + 4));
      }
      if (pNtk->ntkType != ABC_NTK_NONE) {
        nSatConfs = Abc_Clock();
        pAVar2 = pNtkTemp;
        if (pNtk->vCos == (Vec_Ptr_t *)0x0) {
          local_a8 = 0;
        }
        else {
          local_a8 = (long)pNtk->vCos - (long)pNtk->vBoxes;
        }
        _nIter = pNtkTemp;
        iVar3 = *(int *)((long)&pNtk->vObjs + 4);
        dVar10 = pow((double)*(float *)&pNtk->vPis,(double)Counter);
        pNtkTemp = Abc_NtkMiterFraig(pAVar2,(int)((double)iVar3 * dVar10),local_a8,&nSatFails,
                                     (int *)((long)&clk + 4),&nSatInspects,&nInspectLimit);
        Abc_NtkDelete(_nIter);
        Abc_NtkMiterPrint(pNtkTemp,"FRAIGing   ",nSatConfs,*(int *)((long)&pNtk->pName + 4));
        if (-1 < nSatFails) break;
        pNtk->vPios = (Vec_Ptr_t *)((long)&pNtk->vPios->nCap + nSatInspects);
        pNtk->vBoxes = (Vec_Ptr_t *)((long)&pNtk->vBoxes->nCap + nInspectLimit);
        if (((pNtk->vCis != (Vec_Ptr_t *)0x0) && ((long)pNtk->vCis <= (long)pNtk->vPios)) ||
           ((pNtk->vCos != (Vec_Ptr_t *)0x0 && ((long)pNtk->vCos <= (long)pNtk->vBoxes)))) {
          printf("Reached global limit on conflicts/inspects. Quitting.\n");
          *(Abc_Ntk_t **)pPars_local = pNtkTemp;
          return -1;
        }
      }
    }
    if ((nSatFails < 0) && (*(int *)&pNtk->pName != 0)) {
      if (*(int *)((long)&pNtk->pName + 4) != 0) {
        printf("Attempting BDDs with node limit %d ...\n",(ulong)*(uint *)((long)&pNtk->vPis + 4));
        fflush(_stdout);
      }
      nSatConfs = Abc_Clock();
      _nIter = pNtkTemp;
      pNtkTemp = Abc_NtkCollapse(pNtkTemp,*(int *)((long)&pNtk->vPis + 4),0,*(int *)&pNtk->vPos,0,0,
                                 0);
      if (pNtkTemp == (Abc_Ntk_t *)0x0) {
        pNtkTemp = _nIter;
      }
      else {
        Abc_NtkDelete(_nIter);
        iVar3 = Abc_NtkNodeNum(pNtkTemp);
        local_b9 = false;
        if (iVar3 == 1) {
          pAVar5 = Abc_NtkPo(pNtkTemp,0);
          pAVar5 = Abc_ObjFanin0(pAVar5);
          pDVar1 = (DdNode *)(pAVar5->field_5).pData;
          pDVar6 = Cudd_ReadLogicZero((DdManager *)pNtkTemp->pManFunc);
          local_b9 = pDVar1 == pDVar6;
        }
        nSatFails = (int)local_b9;
      }
      Abc_NtkMiterPrint(pNtkTemp,"BDD building",nSatConfs,*(int *)((long)&pNtk->pName + 4));
    }
    if (nSatFails < 0) {
      if (*(int *)((long)&pNtk->pName + 4) != 0) {
        printf("Attempting SAT with conflict limit %d ...\n",(ulong)*(uint *)((long)&pNtk->vPos + 4)
              );
        fflush(_stdout);
      }
      nSatConfs = Abc_Clock();
      if (pNtk->vCos == (Vec_Ptr_t *)0x0) {
        local_d0 = 0;
      }
      else {
        local_d0 = (long)pNtk->vCos - (long)pNtk->vBoxes;
      }
      nSatFails = Abc_NtkMiterSat(pNtkTemp,(long)*(int *)((long)&pNtk->vPos + 4),local_d0,0,
                                  (ABC_INT64_T *)0x0,(ABC_INT64_T *)0x0);
      Abc_NtkMiterPrint(pNtkTemp,"SAT solving",nSatConfs,*(int *)((long)&pNtk->pName + 4));
    }
    if ((nSatFails == 0) && (pNtkTemp->pModel == (int *)0x0)) {
      iVar3 = Abc_NtkCiNum(pNtkTemp);
      piVar7 = (int *)malloc((long)iVar3 << 2);
      pNtkTemp->pModel = piVar7;
      piVar7 = pNtkTemp->pModel;
      iVar3 = Abc_NtkCiNum(pNtkTemp);
      memset(piVar7,0,(long)iVar3 << 2);
    }
    *(Abc_Ntk_t **)pPars_local = pNtkTemp;
    ppNtk_local._4_4_ = nSatFails;
  }
  return ppNtk_local._4_4_;
}

Assistant:

int Abc_NtkMiterProve( Abc_Ntk_t ** ppNtk, void * pPars )
{
    Prove_Params_t * pParams = (Prove_Params_t *)pPars;
    Abc_Ntk_t * pNtk, * pNtkTemp;
    int RetValue = -1, nIter, nSatFails, Counter;
    abctime clk; //, timeStart = Abc_Clock();
    ABC_INT64_T nSatConfs, nSatInspects, nInspectLimit;

    // get the starting network
    pNtk = *ppNtk;
    assert( Abc_NtkIsStrash(pNtk) );
    assert( Abc_NtkPoNum(pNtk) == 1 );
 
    if ( pParams->fVerbose )
    {
        printf( "RESOURCE LIMITS: Iterations = %d. Rewriting = %s. Fraiging = %s.\n",
            pParams->nItersMax, pParams->fUseRewriting? "yes":"no", pParams->fUseFraiging? "yes":"no" );
        printf( "Miter = %d (%3.1f).  Rwr = %d (%3.1f).  Fraig = %d (%3.1f).  Last = %d.\n", 
            pParams->nMiteringLimitStart,  pParams->nMiteringLimitMulti, 
            pParams->nRewritingLimitStart, pParams->nRewritingLimitMulti,
            pParams->nFraigingLimitStart,  pParams->nFraigingLimitMulti, pParams->nMiteringLimitLast );
    }

    // if SAT only, solve without iteration
    if ( !pParams->fUseRewriting && !pParams->fUseFraiging )
    {
        clk = Abc_Clock();
        RetValue = Abc_NtkMiterSat( pNtk, (ABC_INT64_T)pParams->nMiteringLimitLast, (ABC_INT64_T)0, 0, NULL, NULL );
        Abc_NtkMiterPrint( pNtk, "SAT solving", clk, pParams->fVerbose );
        *ppNtk = pNtk;
        return RetValue;
    }

    // check the current resource limits
    for ( nIter = 0; nIter < pParams->nItersMax; nIter++ )
    {
        if ( pParams->fVerbose )
        {
            printf( "ITERATION %2d : Confs = %6d. FraigBTL = %3d. \n", nIter+1, 
                 (int)(pParams->nMiteringLimitStart * pow(pParams->nMiteringLimitMulti,nIter)), 
                 (int)(pParams->nFraigingLimitStart * pow(pParams->nFraigingLimitMulti,nIter)) );
            fflush( stdout );
        }

        // try brute-force SAT
        clk = Abc_Clock();
        nInspectLimit = pParams->nTotalInspectLimit? pParams->nTotalInspectLimit - pParams->nTotalInspectsMade : 0;
        RetValue = Abc_NtkMiterSat( pNtk, (ABC_INT64_T)(pParams->nMiteringLimitStart * pow(pParams->nMiteringLimitMulti,nIter)), (ABC_INT64_T)nInspectLimit, 0, &nSatConfs, &nSatInspects );
        Abc_NtkMiterPrint( pNtk, "SAT solving", clk, pParams->fVerbose );
        if ( RetValue >= 0 )
            break;

        // add to the number of backtracks and inspects
        pParams->nTotalBacktracksMade += nSatConfs;
        pParams->nTotalInspectsMade   += nSatInspects;
        // check if global resource limit is reached
        if ( (pParams->nTotalBacktrackLimit && pParams->nTotalBacktracksMade >= pParams->nTotalBacktrackLimit) ||
             (pParams->nTotalInspectLimit   && pParams->nTotalInspectsMade   >= pParams->nTotalInspectLimit) )
        {
            printf( "Reached global limit on conflicts/inspects. Quitting.\n" );
            *ppNtk = pNtk;
            return -1;
        }

        // try rewriting
        if ( pParams->fUseRewriting )
        {
            clk = Abc_Clock();
            Counter = (int)(pParams->nRewritingLimitStart * pow(pParams->nRewritingLimitMulti,nIter));
//            Counter = 1;
            while ( 1 )
            {
/*
                extern Abc_Ntk_t * Abc_NtkIvyResyn( Abc_Ntk_t * pNtk, int fUpdateLevel, int fVerbose );
                pNtk = Abc_NtkIvyResyn( pNtkTemp = pNtk, 0, 0 );  Abc_NtkDelete( pNtkTemp );
                if ( (RetValue = Abc_NtkMiterIsConstant(pNtk)) >= 0 )
                    break;
                if ( --Counter == 0 )
                    break;
*/
/*
                Abc_NtkRewrite( pNtk, 0, 0, 0, 0, 0 );
                if ( (RetValue = Abc_NtkMiterIsConstant(pNtk)) >= 0 )
                    break;
                if ( --Counter == 0 )
                    break;
*/
                Abc_NtkRewrite( pNtk, 0, 0, 0, 0, 0 );
                if ( (RetValue = Abc_NtkMiterIsConstant(pNtk)) >= 0 )
                    break;
                if ( --Counter == 0 )
                    break;
                Abc_NtkRefactor( pNtk, 10, 16, 0, 0, 0, 0 );
                if ( (RetValue = Abc_NtkMiterIsConstant(pNtk)) >= 0 )
                    break;
                if ( --Counter == 0 )
                    break;
                pNtk = Abc_NtkBalance( pNtkTemp = pNtk, 0, 0, 0 );  Abc_NtkDelete( pNtkTemp );
                if ( (RetValue = Abc_NtkMiterIsConstant(pNtk)) >= 0 )
                    break;
                if ( --Counter == 0 )
                    break;
            }
            Abc_NtkMiterPrint( pNtk, "Rewriting  ", clk, pParams->fVerbose );
        }
 
        if ( pParams->fUseFraiging )
        {
            // try FRAIGing
            clk = Abc_Clock();
            nInspectLimit = pParams->nTotalInspectLimit? pParams->nTotalInspectLimit - pParams->nTotalInspectsMade : 0;
            pNtk = Abc_NtkMiterFraig( pNtkTemp = pNtk, (int)(pParams->nFraigingLimitStart * pow(pParams->nFraigingLimitMulti,nIter)), nInspectLimit, &RetValue, &nSatFails, &nSatConfs, &nSatInspects );  Abc_NtkDelete( pNtkTemp );
            Abc_NtkMiterPrint( pNtk, "FRAIGing   ", clk, pParams->fVerbose );
//            printf( "NumFails = %d\n", nSatFails );
            if ( RetValue >= 0 )
                break;

            // add to the number of backtracks and inspects
            pParams->nTotalBacktracksMade += nSatConfs;
            pParams->nTotalInspectsMade += nSatInspects;
            // check if global resource limit is reached
            if ( (pParams->nTotalBacktrackLimit && pParams->nTotalBacktracksMade >= pParams->nTotalBacktrackLimit) ||
                 (pParams->nTotalInspectLimit   && pParams->nTotalInspectsMade   >= pParams->nTotalInspectLimit) )
            {
                printf( "Reached global limit on conflicts/inspects. Quitting.\n" );
                *ppNtk = pNtk;
                return -1;
            }
        }

    }    

    // try to prove it using brute force SAT
#ifdef ABC_USE_CUDD
    if ( RetValue < 0 && pParams->fUseBdds )
    {
        if ( pParams->fVerbose )
        {
            printf( "Attempting BDDs with node limit %d ...\n", pParams->nBddSizeLimit );
            fflush( stdout );
        }
        clk = Abc_Clock();
        pNtk = Abc_NtkCollapse( pNtkTemp = pNtk, pParams->nBddSizeLimit, 0, pParams->fBddReorder, 0, 0, 0 );
        if ( pNtk )   
        {
            Abc_NtkDelete( pNtkTemp );
            RetValue = ( (Abc_NtkNodeNum(pNtk) == 1) && (Abc_ObjFanin0(Abc_NtkPo(pNtk,0))->pData == Cudd_ReadLogicZero((DdManager *)pNtk->pManFunc)) );
        }
        else 
            pNtk = pNtkTemp;
        Abc_NtkMiterPrint( pNtk, "BDD building", clk, pParams->fVerbose );
    }
#endif

    if ( RetValue < 0 )
    {
        if ( pParams->fVerbose )
        {
            printf( "Attempting SAT with conflict limit %d ...\n", pParams->nMiteringLimitLast );
            fflush( stdout );
        }
        clk = Abc_Clock();
        nInspectLimit = pParams->nTotalInspectLimit? pParams->nTotalInspectLimit - pParams->nTotalInspectsMade : 0;
        RetValue = Abc_NtkMiterSat( pNtk, (ABC_INT64_T)pParams->nMiteringLimitLast, (ABC_INT64_T)nInspectLimit, 0, NULL, NULL );
        Abc_NtkMiterPrint( pNtk, "SAT solving", clk, pParams->fVerbose );
    }

    // assign the model if it was proved by rewriting (const 1 miter)
    if ( RetValue == 0 && pNtk->pModel == NULL )
    {
        pNtk->pModel = ABC_ALLOC( int, Abc_NtkCiNum(pNtk) );
        memset( pNtk->pModel, 0, sizeof(int) * Abc_NtkCiNum(pNtk) );
    }
    *ppNtk = pNtk;
    return RetValue;
}